

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFOutlineDocumentHelper *this,QPDFObjectHandle *name)

{
  element_type *peVar1;
  QPDFObjGen this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  QPDFNameTreeObjectHelper *this_02;
  _Alloc_hider _Var2;
  size_type sVar3;
  undefined8 uVar4;
  element_type *peVar5;
  bool bVar6;
  QPDFObjectHandle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle result;
  QPDFObjectHandle dests;
  string local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  QPDFObjectHandle local_68;
  QPDF local_58;
  string local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  local_88._0_8_ = (element_type *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  bVar6 = QPDFObjectHandle::isName(in_RDX);
  if (bVar6) {
    if ((name[1].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->qpdf == (QPDF *)0x0) {
      QPDF::getRoot((QPDF *)(local_88 + 0x10));
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Dests","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_78 + 0x10),(string *)(local_88 + 0x10));
      _Var7._M_pi = local_68.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      peVar5 = local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar1 = name[1].super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = peVar1->og;
      peVar1->qpdf = (QPDF *)peVar5;
      peVar1->og = (QPDFObjGen)_Var7._M_pi;
      if (this_00 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((QPDFObjGen)
          local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
    }
    peVar1 = name[1].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    QPDFObjectHandle::getName_abi_cxx11_(&local_a8,in_RDX);
    QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)(local_78 + 0x10),(string *)&peVar1->qpdf);
    _Var7._M_pi = local_68.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_88._0_8_ =
         local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    uVar4 = local_88._8_8_;
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._8_8_ = _Var7._M_pi;
    if ((QPDFObjGen)uVar4 != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((QPDFObjGen)
        local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (QPDFObjGen)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  else {
    bVar6 = QPDFObjectHandle::isString(in_RDX);
    if (!bVar6) goto LAB_001d0221;
    if ((name[1].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->parsed_offset == 0) {
      QPDF::getRoot((QPDF *)&local_48);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Names","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_48.field_2,&local_48);
      local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"/Dests","");
      QPDFObjectHandle::getKeyIfDict
                ((QPDFObjectHandle *)(local_88 + 0x10),(string *)&local_48.field_2);
      if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)&local_58) {
        operator_delete(local_68.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)((long)local_58.m._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl +
                               1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
      }
      bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_88 + 0x10));
      if (bVar6) {
        local_a8._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<QPDFNameTreeObjectHelper,std::allocator<QPDFNameTreeObjectHelper>,QPDFObjectHandle&,QPDF&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
                   (QPDFNameTreeObjectHelper **)&local_a8,
                   (allocator<QPDFNameTreeObjectHelper> *)(local_78 + 0x10),
                   (QPDFObjectHandle *)(local_88 + 0x10),
                   (QPDF *)(name->super_BaseHandle).obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        sVar3 = local_a8._M_string_length;
        _Var2._M_p = local_a8._M_dataplus._M_p;
        peVar1 = name[1].super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   &peVar1[1].value.
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        ;
        peVar1->parsed_offset = (qpdf_offset_t)_Var2._M_p;
        *(size_type *)
         &peVar1[1].value.
          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          .
          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             = sVar3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
    }
    this_02 = (QPDFNameTreeObjectHelper *)
              (name[1].super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
    if (this_02 == (QPDFNameTreeObjectHelper *)0x0) goto LAB_001d0221;
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_a8,in_RDX);
    QPDFNameTreeObjectHelper::findObject(this_02,&local_a8,(QPDFObjectHandle *)local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
LAB_001d0221:
  if ((element_type *)local_88._0_8_ == (element_type *)0x0) {
    QVar8 = QPDFObjectHandle::newNull();
    _Var7._M_pi = QVar8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_88);
    uVar4 = local_88._8_8_;
    if (bVar6) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/D","");
      QVar8 = QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_88);
      _Var7._M_pi = QVar8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        _Var7._M_pi = extraout_RDX_00;
      }
    }
    else {
      (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper = (_func_int **)local_88._0_8_;
      (this->super_QPDFDocumentHelper).qpdf = (QPDF *)0x0;
      local_88._8_4_ = 0;
      local_88._12_4_ = 0;
      (this->super_QPDFDocumentHelper).qpdf = (QPDF *)uVar4;
      local_88._0_8_ = (element_type *)0x0;
      _Var7._M_pi = extraout_RDX;
    }
  }
  if ((QPDFObjGen)local_88._8_8_ != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    _Var7._M_pi = extraout_RDX_01;
  }
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineDocumentHelper::resolveNamedDest(QPDFObjectHandle name)
{
    QPDFObjectHandle result;
    if (name.isName()) {
        if (!m->dest_dict) {
            m->dest_dict = qpdf.getRoot().getKey("/Dests");
        }
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper name named dest");
        result = m->dest_dict.getKeyIfDict(name.getName());
    } else if (name.isString()) {
        if (!m->names_dest) {
            auto dests = qpdf.getRoot().getKey("/Names").getKeyIfDict("/Dests");
            if (dests.isDictionary()) {
                m->names_dest = std::make_shared<QPDFNameTreeObjectHelper>(dests, qpdf);
            }
        }
        if (m->names_dest) {
            if (m->names_dest->findObject(name.getUTF8Value(), result)) {
                QTC::TC("qpdf", "QPDFOutlineDocumentHelper string named dest");
            }
        }
    }
    if (!result) {
        return QPDFObjectHandle::newNull();
    }
    if (result.isDictionary()) {
        QTC::TC("qpdf", "QPDFOutlineDocumentHelper named dest dictionary");
        return result.getKey("/D");
    }
    return result;
}